

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::QMdiArea(QMdiArea *this,QWidget *parent)

{
  QMdiAreaPrivate *this_00;
  QCoreApplication *pQVar1;
  QWidget *in_RSI;
  QAbstractScrollAreaPrivate *in_RDI;
  QAbstractScrollArea *unaff_retaddr;
  QWidget *in_stack_00000008;
  QAbstractScrollArea *in_stack_00000010;
  FocusPolicy in_stack_ffffffffffffffdc;
  ScrollBarPolicy policy;
  QAbstractScrollAreaPrivate *dd;
  
  dd = in_RDI;
  this_00 = (QMdiAreaPrivate *)operator_new(1000);
  QMdiAreaPrivate::QMdiAreaPrivate(this_00);
  QAbstractScrollArea::QAbstractScrollArea(unaff_retaddr,dd,in_RSI);
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate = &PTR_metaObject_00d166a0;
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QMdiArea_00d16878;
  QWidget::palette((QWidget *)this_00);
  QPalette::brush((QPalette *)this_00,in_stack_ffffffffffffffdc);
  setBackground((QMdiArea *)in_RSI,(QBrush *)in_RDI);
  policy = (ScrollBarPolicy)((ulong)in_RDI >> 0x20);
  QFrame::setFrameStyle((QFrame *)in_RSI,policy);
  QAbstractScrollArea::setHorizontalScrollBarPolicy((QAbstractScrollArea *)in_RSI,policy);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)in_RSI,policy);
  QAbstractScrollArea::setViewport(in_stack_00000010,in_stack_00000008);
  QWidget::setFocusPolicy((QWidget *)this_00,in_stack_ffffffffffffffdc);
  pQVar1 = QCoreApplication::instance();
  QObject::installEventFilter((QObject *)pQVar1);
  return;
}

Assistant:

QMdiArea::QMdiArea(QWidget *parent)
    : QAbstractScrollArea(*new QMdiAreaPrivate, parent)
{
    setBackground(palette().brush(QPalette::Dark));
    setFrameStyle(QFrame::NoFrame);
    setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setViewport(nullptr);
    setFocusPolicy(Qt::NoFocus);
    QApplication::instance()->installEventFilter(this);
}